

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlElement.cpp
# Opt level: O1

int64 libebml::ReadCodedSizeSignedValue(binary *InBuffer,uint32 *BufferSize,uint64 *SizeUnknown)

{
  uint64 uVar1;
  
  uVar1 = ReadCodedSizeValue(InBuffer,BufferSize,SizeUnknown);
  switch(*BufferSize) {
  case 1:
    uVar1 = uVar1 - 0x3f;
    break;
  case 2:
    uVar1 = uVar1 - 0x1fff;
    break;
  case 3:
    uVar1 = uVar1 - 0xfffff;
    break;
  case 4:
    uVar1 = uVar1 - 0x7ffffff;
  }
  return uVar1;
}

Assistant:

int64 ReadCodedSizeSignedValue(const binary * InBuffer, uint32 & BufferSize, uint64 & SizeUnknown)
{
  int64 Result = ReadCodedSizeValue(InBuffer, BufferSize, SizeUnknown);

  if (BufferSize != 0) {
    switch (BufferSize) {
      case 1:
        Result -= 63;
        break;
      case 2:
        Result -= 8191;
        break;
      case 3:
        Result -= 1048575L;
        break;
      case 4:
        Result -= 134217727L;
        break;
    }
  }

  return Result;
}